

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateBiasLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  bool bVar1;
  WeightParamType WVar2;
  uint uVar3;
  BiasLayerParams *this_00;
  uint64 uVar4;
  int i;
  int index;
  WeightParams *pWVar5;
  string *psVar6;
  uint64_t expectedUnits;
  string err_1;
  string err;
  Result r;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  Result::Result(&r);
  validateInputCount((Result *)&err_1,layer,1,1);
  Result::operator=(&r,(Result *)&err_1);
  std::__cxx11::string::~string((string *)&err_1._M_string_length);
  bVar1 = Result::good(&r);
  if (bVar1) {
    validateOutputCount((Result *)&err_1,layer,1,1);
    Result::operator=(&r,(Result *)&err_1);
    std::__cxx11::string::~string((string *)&err_1._M_string_length);
  }
  bVar1 = Result::good(&r);
  if (bVar1) {
    if (this->ndArrayInterpretation != true) {
LAB_0059182d:
      this_00 = Specification::NeuralNetworkLayer::bias(layer);
      pWVar5 = this_00->bias_;
      if (pWVar5 == (WeightParams *)0x0) {
        pWVar5 = (WeightParams *)&Specification::_WeightParams_default_instance_;
      }
      WVar2 = valueType(pWVar5);
      if (WVar2 == UNSPECIFIED) {
        std::operator+(&err_1,"Bias product layer \'",(layer->name_).ptr_);
        std::operator+(&err,&err_1,
                       "\' has both full precision and half precision weights and/or bias fields populated"
                      );
        std::__cxx11::string::~string((string *)&err_1);
        Result::Result((Result *)&err_1,INVALID_MODEL_PARAMETERS,&err);
        Result::operator=(&r,(Result *)&err_1);
        std::__cxx11::string::~string((string *)&err_1._M_string_length);
        Result::Result(__return_storage_ptr__,&r);
        psVar6 = &err;
      }
      else {
        uVar3 = (this_00->shape_).current_size_;
        if ((uVar3 | 2) == 3) {
          expectedUnits = 1;
          for (index = 0; index < (int)uVar3; index = index + 1) {
            uVar4 = Specification::BiasLayerParams::shape(this_00,index);
            expectedUnits = expectedUnits * uVar4;
            uVar3 = (this_00->shape_).current_size_;
          }
          if (uVar3 == 3) {
            uVar4 = Specification::BiasLayerParams::shape(this_00,0);
            if (uVar4 < 2) goto LAB_0059198f;
            pWVar5 = this_00->bias_;
            if (pWVar5 == (WeightParams *)0x0) {
              pWVar5 = (WeightParams *)&Specification::_WeightParams_default_instance_;
            }
            uVar4 = Specification::BiasLayerParams::shape(this_00,0);
            std::__cxx11::string::string((string *)&err,"Bias",(allocator *)&local_70);
            psVar6 = (layer->name_).ptr_;
            std::__cxx11::string::string((string *)&local_b0,"bias",(allocator *)&local_90);
            validateGeneralWeightParams
                      ((Result *)&err_1,pWVar5,expectedUnits,uVar4,&err,psVar6,&local_b0);
          }
          else {
LAB_0059198f:
            pWVar5 = this_00->bias_;
            if (pWVar5 == (WeightParams *)0x0) {
              pWVar5 = (WeightParams *)&Specification::_WeightParams_default_instance_;
            }
            std::__cxx11::string::string((string *)&err,"Bias",(allocator *)&local_70);
            psVar6 = (layer->name_).ptr_;
            std::__cxx11::string::string((string *)&local_b0,"bias",(allocator *)&local_90);
            validateGeneralWeightParams
                      ((Result *)&err_1,pWVar5,expectedUnits,1,&err,psVar6,&local_b0);
          }
          Result::operator=(&r,(Result *)&err_1);
          std::__cxx11::string::~string((string *)&err_1._M_string_length);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&err);
          goto LAB_00591a25;
        }
        std::operator+(&local_70,"Bias layer \'",(layer->name_).ptr_);
        std::operator+(&local_b0,&local_70,"\' cannot be ");
        std::__cxx11::to_string(&local_90,(this_00->shape_).current_size_);
        std::operator+(&err,&local_b0,&local_90);
        std::operator+(&err_1,&err," dimensional. Must be 1D or 3D.");
        std::__cxx11::string::~string((string *)&err);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_70);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err_1);
        psVar6 = &err_1;
      }
      std::__cxx11::string::~string((string *)psVar6);
      goto LAB_00591aef;
    }
    std::__cxx11::string::string((string *)&local_50,"Bias",(allocator *)&err);
    validateInputOutputRankEquality((Result *)&err_1,layer,&local_50,&this->blobNameToRank);
    Result::operator=(&r,(Result *)&err_1);
    std::__cxx11::string::~string((string *)&err_1._M_string_length);
    std::__cxx11::string::~string((string *)&local_50);
    bVar1 = Result::good(&r);
    if (bVar1) {
      std::__cxx11::string::string((string *)&err,"Bias",(allocator *)&local_b0);
      validateRankCount((Result *)&err_1,layer,&err,3,-1,&this->blobNameToRank);
      Result::operator=(&r,(Result *)&err_1);
      std::__cxx11::string::~string((string *)&err_1._M_string_length);
      std::__cxx11::string::~string((string *)&err);
      bVar1 = Result::good(&r);
      if (bVar1) goto LAB_0059182d;
    }
  }
LAB_00591a25:
  Result::Result(__return_storage_ptr__,&r);
LAB_00591aef:
  std::__cxx11::string::~string((string *)&r.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateBiasLayer(const Specification::NeuralNetworkLayer& layer) {

    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }
    if (!r.good()) {
        return r;
    }

    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Bias", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "Bias", 3, -1, blobNameToRank);
        if (!r.good()) {return r;}
    }

    const auto& params = layer.bias();
    WeightParamType paramType = valueType(params.bias());

    // Only float32 or float16 parameters can be populated at any time
    if (paramType == UNSPECIFIED) {
        std::string err = "Bias product layer '" + layer.name() + "' has both full precision and half precision weights and/or bias fields populated";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }

    if (params.shape_size() != 1 && params.shape_size() != 3) {
        std::string err = "Bias layer '" + layer.name() + "' cannot be " + std::to_string(params.shape_size()) + " dimensional. Must be 1D or 3D.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    // shape can be ``[1]``, ``[C]``, ``[1, H, W]`` or ``[C, H, W]``
    size_t total_shape = 1;
    for (int i = 0; i < params.shape_size(); i++) {
        total_shape *= params.shape(i);
    }
    if (params.shape_size() == 3 && params.shape(0) > 1){
        r = validateGeneralWeightParams(params.bias(), total_shape, params.shape(0), "Bias", layer.name(), "bias");
    } else {
        r = validateGeneralWeightParams(params.bias(), total_shape, 1, "Bias", layer.name(), "bias");
    }

    return r;
}